

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_quaternion.c
# Opt level: O0

char * test_quaternion_get_eulers_create_quaternion_ZYX(void)

{
  short sVar1;
  int iVar2;
  double local_80;
  double out_anglez;
  double out_angley;
  double out_anglex;
  double in_anglez;
  double in_angley;
  double in_anglex;
  quaternion q2;
  quaternion q1;
  
  in_angley = 0.800000011920929;
  in_anglez = 0.699999988079071;
  out_anglex = 0.4320000112056732;
  quaternion_set_from_euler_anglesf3
            ((quaternion *)((long)&q2.field_0 + 0x18),0.800000011920929,0.699999988079071,
             0.4320000112056732);
  quaternion_get_euler_anglesf3
            ((quaternion *)((long)&q2.field_0 + 0x18),&out_angley,&out_anglez,&local_80);
  sVar1 = scalar_equalsf(in_angley,out_angley);
  if (sVar1 == 0) {
    q1.field_0.q[3] = (double)anon_var_dwarf_2f3;
  }
  else {
    sVar1 = scalar_equalsf(in_anglez,out_anglez);
    if (sVar1 == 0) {
      q1.field_0.q[3] = (double)anon_var_dwarf_30a;
    }
    else {
      sVar1 = scalar_equalsf(out_anglex,local_80);
      if (sVar1 == 0) {
        q1.field_0.q[3] = (double)anon_var_dwarf_315;
      }
      else {
        quaternion_set_from_euler_anglesf3((quaternion *)&in_anglex,out_angley,out_anglez,local_80);
        iVar2 = quaternion_equals((quaternion *)((long)&q2.field_0 + 0x18),(quaternion *)&in_anglex)
        ;
        if (iVar2 == 0) {
          q1.field_0.q[3] = (double)anon_var_dwarf_320;
        }
        else {
          q1.field_0.q[3] = 0.0;
        }
      }
    }
  }
  return (char *)q1.field_0.q[3];
}

Assistant:

static char *test_quaternion_get_eulers_create_quaternion_ZYX(void)
{
	struct quaternion q1, q2;
	HYP_FLOAT in_anglex, in_angley, in_anglez;
	HYP_FLOAT out_anglex, out_angley, out_anglez;

	in_anglex = 0.8f;
	in_angley = 0.7f;
	in_anglez = 0.432f;

	/* make a quaternion out of some arbitrary euler angles */
	quaternion_set_from_euler_anglesf3(&q1, in_anglex, in_angley, in_anglez);

	/* get the angles */
	quaternion_get_euler_anglesf3(&q1, &out_anglex, &out_angley, &out_anglez);

	/* test */
	test_assert(scalar_equals(in_anglex, out_anglex));
	test_assert(scalar_equals(in_angley, out_angley));
	test_assert(scalar_equals(in_anglez, out_anglez));

	/* compose new quaternions with the eulers */
	quaternion_set_from_euler_anglesf3(&q2, out_anglex, out_angley, out_anglez);

	/* same */
	test_assert(quaternion_equals(&q1, &q2));

	return NULL;
}